

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O2

void recff_ffi_string(jit_State *J,RecordFFData *rd)

{
  uint sp;
  CTState *cts;
  IRRef1 IVar1;
  TRef TVar3;
  TRef TVar2;
  
  TVar3 = *J->base;
  if (TVar3 != 0) {
    cts = (CTState *)J[-1].penalty[0x3b].pc.ptr64;
    sp = J->base[1];
    if ((sp & 0x1f000000) == 0) {
      TVar3 = crec_ct_tv(J,cts->tab + 0x13,0,TVar3,rd->argv);
      TVar2 = lj_ir_call(J,IRCALL_strlen,(ulong)TVar3);
      IVar1 = (IRRef1)TVar2;
    }
    else {
      TVar2 = crec_toint(J,cts,sp,rd->argv + 1);
      IVar1 = (IRRef1)TVar2;
      TVar3 = crec_ct_tv(J,cts->tab + 0x12,0,TVar3,rd->argv);
    }
    (J->fold).ins.field_0.ot = 0x5004;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
    (J->fold).ins.field_0.op2 = IVar1;
    TVar3 = lj_opt_fold(J);
    *J->base = TVar3;
  }
  return;
}

Assistant:

void LJ_FASTCALL recff_ffi_string(jit_State *J, RecordFFData *rd)
{
  CTState *cts = ctype_ctsG(J2G(J));
  TRef tr = J->base[0];
  if (tr) {
    TRef trlen = J->base[1];
    if (!tref_isnil(trlen)) {
      trlen = crec_toint(J, cts, trlen, &rd->argv[1]);
      tr = crec_ct_tv(J, ctype_get(cts, CTID_P_CVOID), 0, tr, &rd->argv[0]);
    } else {
      tr = crec_ct_tv(J, ctype_get(cts, CTID_P_CCHAR), 0, tr, &rd->argv[0]);
      trlen = lj_ir_call(J, IRCALL_strlen, tr);
    }
    J->base[0] = emitir(IRT(IR_XSNEW, IRT_STR), tr, trlen);
  }  /* else: interpreter will throw. */
}